

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kparser-standard.cc
# Opt level: O2

void __thiscall
ParserBuilder::ParserBuilder
          (ParserBuilder *this,Model *model,
          unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          *pretrained)

{
  uint uVar1;
  LookupParameters *pLVar2;
  Parameters *pPVar3;
  LSTMBuilder *this_00;
  __node_base *p_Var4;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<unsigned_int> x_10;
  initializer_list<unsigned_int> x_11;
  initializer_list<unsigned_int> x_12;
  initializer_list<unsigned_int> x_13;
  initializer_list<unsigned_int> x_14;
  initializer_list<unsigned_int> x_15;
  initializer_list<unsigned_int> x_16;
  initializer_list<unsigned_int> x_17;
  initializer_list<unsigned_int> x_18;
  initializer_list<unsigned_int> x_19;
  initializer_list<unsigned_int> x_20;
  uint local_78;
  uint local_74;
  value_type it;
  
  cnn::LSTMBuilder::LSTMBuilder(&this->stack_lstm,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,model);
  cnn::LSTMBuilder::LSTMBuilder(&this->action_lstm,LAYERS,ACTION_DIM,HIDDEN_DIM,model);
  cnn::LSTMBuilder::LSTMBuilder(&this->const_lstm_fwd,LAYERS,LSTM_INPUT_DIM,LSTM_INPUT_DIM,model);
  cnn::LSTMBuilder::LSTMBuilder(&this->const_lstm_rev,LAYERS,LSTM_INPUT_DIM,LSTM_INPUT_DIM,model);
  uVar1 = VOCAB_SIZE;
  local_78 = INPUT_DIM;
  x._M_len = 1;
  x._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x);
  pLVar2 = cnn::Model::add_lookup_parameters(model,uVar1,(Dim *)&it);
  this->p_w = pLVar2;
  uVar1 = VOCAB_SIZE;
  local_78 = INPUT_DIM;
  x_00._M_len = 1;
  x_00._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_00);
  pLVar2 = cnn::Model::add_lookup_parameters(model,uVar1,(Dim *)&it);
  this->p_t = pLVar2;
  uVar1 = NT_SIZE;
  local_78 = LSTM_INPUT_DIM;
  x_01._M_len = 1;
  x_01._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_01);
  pLVar2 = cnn::Model::add_lookup_parameters(model,uVar1,(Dim *)&it);
  this->p_nt = pLVar2;
  uVar1 = NT_SIZE;
  local_78 = LSTM_INPUT_DIM;
  x_02._M_len = 1;
  x_02._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_02);
  pLVar2 = cnn::Model::add_lookup_parameters(model,uVar1,(Dim *)&it);
  this->p_ntup = pLVar2;
  uVar1 = ACTION_SIZE;
  local_78 = ACTION_DIM;
  x_03._M_len = 1;
  x_03._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_03);
  pLVar2 = cnn::Model::add_lookup_parameters(model,uVar1,(Dim *)&it);
  this->p_a = pLVar2;
  local_78 = HIDDEN_DIM;
  x_04._M_len = 1;
  x_04._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_04);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_pbias = pPVar3;
  local_78 = HIDDEN_DIM;
  local_74 = HIDDEN_DIM;
  x_05._M_len = 2;
  x_05._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_05);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_A = pPVar3;
  local_78 = HIDDEN_DIM;
  local_74 = HIDDEN_DIM;
  x_06._M_len = 2;
  x_06._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_06);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_B = pPVar3;
  local_78 = HIDDEN_DIM;
  local_74 = HIDDEN_DIM;
  x_07._M_len = 2;
  x_07._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_07);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_S = pPVar3;
  local_78 = LSTM_INPUT_DIM;
  local_74 = INPUT_DIM;
  x_08._M_len = 2;
  x_08._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_08);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_w2l = pPVar3;
  local_78 = LSTM_INPUT_DIM;
  x_09._M_len = 1;
  x_09._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_09);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_ib = pPVar3;
  local_78 = LSTM_INPUT_DIM;
  x_10._M_len = 1;
  x_10._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_10);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_cbias = pPVar3;
  local_78 = ACTION_SIZE;
  local_74 = HIDDEN_DIM;
  x_11._M_len = 2;
  x_11._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_11);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_p2a = pPVar3;
  local_78 = ACTION_DIM;
  x_12._M_len = 1;
  x_12._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_12);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_action_start = pPVar3;
  local_78 = ACTION_SIZE;
  x_13._M_len = 1;
  x_13._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_13);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_abias = pPVar3;
  local_78 = LSTM_INPUT_DIM;
  x_14._M_len = 1;
  x_14._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_14);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_buffer_guard = pPVar3;
  local_78 = LSTM_INPUT_DIM;
  x_15._M_len = 1;
  x_15._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_15);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_stack_guard = pPVar3;
  local_78 = LSTM_INPUT_DIM;
  local_74 = LSTM_INPUT_DIM * 2;
  x_16._M_len = 2;
  x_16._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_16);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_cW = pPVar3;
  uVar1 = POS_SIZE;
  local_78 = POS_DIM;
  x_17._M_len = 1;
  x_17._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_17);
  pLVar2 = cnn::Model::add_lookup_parameters(model,uVar1,(Dim *)&it);
  this->p_pos = pLVar2;
  local_78 = LSTM_INPUT_DIM;
  local_74 = POS_DIM;
  x_18._M_len = 2;
  x_18._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_18);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_p2w = pPVar3;
  this_00 = (LSTMBuilder *)operator_new(200);
  cnn::LSTMBuilder::LSTMBuilder(this_00,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,model);
  this->buffer_lstm = this_00;
  uVar1 = VOCAB_SIZE;
  local_78 = PRETRAINED_DIM;
  x_19._M_len = 1;
  x_19._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_19);
  pLVar2 = cnn::Model::add_lookup_parameters(model,uVar1,(Dim *)&it);
  p_Var4 = &(pretrained->_M_h)._M_before_begin;
  this->p_t = pLVar2;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>::pair
              (&it,(pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_> *)
                   (p_Var4 + 1));
    cnn::LookupParameters::Initialize(this->p_t,it.first,&it.second);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&it.second.super__Vector_base<float,_std::allocator<float>_>);
  }
  local_78 = LSTM_INPUT_DIM;
  local_74 = PRETRAINED_DIM;
  x_20._M_len = 2;
  x_20._M_array = &local_78;
  cnn::Dim::Dim((Dim *)&it,x_20);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)&it,0.0);
  this->p_t2l = pPVar3;
  return;
}

Assistant:

explicit ParserBuilder(Model* model, const unordered_map<unsigned, vector<float>>& pretrained) :
      stack_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      action_lstm(LAYERS, ACTION_DIM, HIDDEN_DIM, model),
      const_lstm_fwd(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model), // used to compose children of a node into a representation of the node
      const_lstm_rev(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model), // used to compose children of a node into a representation of the node
      p_w(model->add_lookup_parameters(VOCAB_SIZE, {INPUT_DIM})),
      p_t(model->add_lookup_parameters(VOCAB_SIZE, {INPUT_DIM})),
      p_nt(model->add_lookup_parameters(NT_SIZE, {LSTM_INPUT_DIM})),
      p_ntup(model->add_lookup_parameters(NT_SIZE, {LSTM_INPUT_DIM})),
      p_a(model->add_lookup_parameters(ACTION_SIZE, {ACTION_DIM})),
      p_pbias(model->add_parameters({HIDDEN_DIM})),
      p_A(model->add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_B(model->add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_S(model->add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_w2l(model->add_parameters({LSTM_INPUT_DIM, INPUT_DIM})),
      p_ib(model->add_parameters({LSTM_INPUT_DIM})),
      p_cbias(model->add_parameters({LSTM_INPUT_DIM})),
      p_p2a(model->add_parameters({ACTION_SIZE, HIDDEN_DIM})),
      p_action_start(model->add_parameters({ACTION_DIM})),
      p_abias(model->add_parameters({ACTION_SIZE})),

      p_buffer_guard(model->add_parameters({LSTM_INPUT_DIM})),
      p_stack_guard(model->add_parameters({LSTM_INPUT_DIM})),

      p_cW(model->add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM * 2})) {
      
      p_pos = model->add_lookup_parameters(POS_SIZE, {POS_DIM});
      p_p2w = model->add_parameters({LSTM_INPUT_DIM, POS_DIM});
    
      buffer_lstm = new LSTMBuilder(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model);
      
      p_t = model->add_lookup_parameters(VOCAB_SIZE, {PRETRAINED_DIM});
      for (auto it : pretrained) p_t->Initialize(it.first, it.second);
      p_t2l = model->add_parameters({LSTM_INPUT_DIM, PRETRAINED_DIM});
  }